

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffpsvc(char *card,char *value,char *comm,int *status)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  char strbuf [21];
  char local_48 [20];
  undefined1 local_34;
  
  if (0 < *status) {
    return *status;
  }
  *value = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  sVar3 = strlen(card);
  if (0x50 < sVar3) {
    strncpy(local_48,card,0x14);
    local_34 = 0;
    ffxmsg(5,"The card string starting with the chars below is too long:");
    ffxmsg(5,local_48);
    *status = 0xcf;
    return 0xcf;
  }
  cVar8 = *card;
  iVar11 = (int)sVar3;
  if (cVar8 == 'H') {
    iVar2 = strncmp(card,"HIERARCH ",9);
    if (iVar2 != 0) {
      if (sVar3 < 9) goto LAB_001411d3;
      pcVar12 = "HISTORY ";
      goto LAB_00140ed7;
    }
    sVar4 = strcspn(card,"=");
    if (sVar4 == sVar3) {
      if (8 < sVar3 && comm != (char *)0x0) {
        strcpy(comm,card + 8);
        uVar9 = iVar11 - 9;
        do {
          if (comm[uVar9] != ' ') break;
          comm[uVar9] = '\0';
          bVar1 = 0 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar1);
      }
      goto LAB_001411d3;
    }
LAB_00140f4d:
    lVar10 = sVar4 + 1;
  }
  else {
    if (sVar3 < 9) goto LAB_001411d3;
    if (cVar8 == ' ') {
      pcVar12 = "        ";
LAB_00140ed7:
      iVar2 = strncmp(card,pcVar12,8);
      if (iVar2 == 0) {
LAB_00140f97:
        if (comm != (char *)0x0) {
          strcpy(comm,card + 8);
          uVar9 = iVar11 - 9;
          do {
            if (comm[uVar9] != ' ') break;
            comm[uVar9] = '\0';
            bVar1 = 0 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar1);
        }
        goto LAB_001411d3;
      }
    }
    else {
      if (cVar8 == 'E') {
        pcVar12 = "END     ";
        goto LAB_00140ed7;
      }
      if (cVar8 == 'C') {
        iVar2 = strncmp(card,"COMMENT ",8);
        if (iVar2 != 0) {
          pcVar12 = "CONTINUE";
          goto LAB_00140ed7;
        }
        goto LAB_00140f97;
      }
    }
    if ((card[8] != '=') || (lVar10 = 10, card[9] != ' ')) {
      sVar4 = strcspn(card,"=");
      if (sVar4 == sVar3) {
        if (comm != (char *)0x0) {
          strcpy(comm,card + 8);
          uVar9 = iVar11 - 9;
          do {
            if (comm[uVar9] != ' ') break;
            comm[uVar9] = '\0';
            bVar1 = 0 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar1);
        }
        goto LAB_001411d3;
      }
      goto LAB_00140f4d;
    }
  }
  sVar4 = strspn(card + lVar10," ");
  uVar5 = sVar4 + lVar10;
  if (uVar5 != sVar3) {
    cVar8 = card[uVar5];
    if (cVar8 == '\'') {
      *value = '\'';
      uVar6 = uVar5 + 1;
      iVar11 = 1;
      if (uVar6 < sVar3) {
        iVar11 = 1;
        uVar7 = uVar6;
        do {
          cVar8 = card[uVar7];
          iVar2 = iVar11;
          if (cVar8 == '\'') {
            cVar8 = card[uVar5 + 2];
            value[iVar11] = '\'';
            uVar6 = uVar7;
            if (cVar8 != '\'') break;
            if (0x44 < iVar11) {
              uVar6 = uVar5 + 3;
              iVar11 = 0x47;
              goto LAB_00141126;
            }
            uVar7 = uVar5 + 2;
            cVar8 = card[uVar7];
            iVar2 = iVar11 + 1;
          }
          value[iVar2] = cVar8;
          iVar11 = iVar2 + 1;
          uVar6 = uVar7 + 1;
          uVar5 = uVar7;
          if ((sVar3 <= uVar6) || (uVar7 = uVar6, 0x44 < iVar2)) break;
        } while( true );
      }
      if ((uVar6 == sVar3) || (0x45 < iVar11)) {
LAB_00141126:
        iVar2 = 0x45;
        if (iVar11 < 0x45) {
          iVar2 = iVar11;
        }
        (value + iVar2)[0] = '\'';
        (value + iVar2)[1] = '\0';
        ffxmsg(5,"This keyword string value has no closing quote:");
        ffxmsg(5,card);
      }
      else {
        value[(long)iVar11 + 1] = '\0';
        uVar6 = uVar5 + 2;
      }
    }
    else {
      pcVar12 = card + uVar5;
      if (cVar8 == '(') {
        sVar3 = strcspn(pcVar12,")");
        sVar4 = strlen(pcVar12);
        if ((0x45 < sVar3) || (sVar3 == sVar4)) {
          ffxmsg(5,"This complex keyword value has no closing \')\' within range:");
          ffxmsg(5,card);
          *status = 0xcd;
          return 0xcd;
        }
        strncpy(value,pcVar12,sVar3 + 1);
        value[sVar3 + 1] = '\0';
        uVar6 = sVar3 + uVar5 + 1;
      }
      else if (cVar8 == '/') {
        uVar6 = uVar5 + 1;
      }
      else {
        sVar4 = strcspn(pcVar12," /");
        sVar3 = 0x46;
        if (sVar4 < 0x46) {
          sVar3 = sVar4;
        }
        strncpy(value,pcVar12,sVar3);
        value[sVar3] = '\0';
        uVar6 = sVar3 + uVar5;
      }
    }
    if (comm != (char *)0x0) {
      sVar3 = strspn(card + uVar6," ");
      uVar6 = sVar3 + uVar6;
      if (uVar6 < 0x50) {
        uVar5 = uVar6;
        if (card[uVar6] == '/') {
          uVar5 = uVar6 + 1;
          if (card[uVar6 + 1] == ' ') {
            uVar5 = uVar6 + 2;
          }
        }
        strncpy(comm,card + uVar5,0x48);
        comm[0x48] = '\0';
        sVar3 = strlen(comm);
        if (0 < (int)(uint)sVar3) {
          uVar5 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
          do {
            if (comm[uVar5 - 2] != ' ') break;
            comm[uVar5 - 2] = '\0';
            uVar5 = uVar5 - 1;
          } while (1 < uVar5);
        }
      }
    }
  }
LAB_001411d3:
  return *status;
}

Assistant:

int ffpsvc(char *card,    /* I - FITS header card (nominally 80 bytes long) */
           char *value,   /* O - value string parsed from the card */
           char *comm,    /* O - comment string parsed from the card */
           int *status)   /* IO - error status   */
/*
  ParSe the Value and Comment strings from the input header card string.
  If the card contains a quoted string value, the returned value string
  includes the enclosing quote characters.  If comm = NULL, don't return
  the comment string.
*/
{
    int jj;
    size_t ii, cardlen, nblank, valpos;
    char strbuf[21];

    if (*status > 0)
        return(*status);

    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    cardlen = strlen(card);
    if (cardlen >= FLEN_CARD)
    {
       strncpy(strbuf,card,20);
       strbuf[20]='\0';
       ffpmsg("The card string starting with the chars below is too long:");
       ffpmsg(strbuf); 
       return(*status = BAD_KEYCHAR);
    }

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }
    else if (cardlen < 9  ||
        FSTRNCMP(card, "COMMENT ", 8) == 0 ||  /* keywords with no value */
        FSTRNCMP(card, "HISTORY ", 8) == 0 ||
        FSTRNCMP(card, "END     ", 8) == 0 ||
        FSTRNCMP(card, "CONTINUE", 8) == 0 ||
        FSTRNCMP(card, "        ", 8) == 0 )
    {
        /*  no value, so the comment extends from cols 9 - 80  */
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
             strcpy(comm, &card[8]);

             jj=cardlen - 8;
             for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
             {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
             }
          }
        }
        return(*status);
    }
    else if (FSTRNCMP(&card[8], "= ", 2) == 0  )
    {
        /* normal keyword with '= ' in cols 9-10 */
        valpos = 10;  /* starting position of the value field */
    }
    else
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }

    nblank = strspn(&card[valpos], " "); /* find number of leading blanks */

    if (nblank + valpos == cardlen)
    {
      /* the absence of a value string is legal, and simply indicates
         that the keyword value is undefined.  Don't write an error
         message in this case.
      */
        return(*status);
    }

    ii = valpos + nblank;

    if (card[ii] == '/' )  /* slash indicates start of the comment */
    {
         ii++;
    }
    else if (card[ii] == '\'' )  /* is this a quoted string value? */
    {
        value[0] = card[ii];
        for (jj=1, ii++; ii < cardlen && jj < FLEN_VALUE-1; ii++, jj++)
        {
            if (card[ii] == '\'')  /*  is this the closing quote?  */
            {
                if (card[ii+1] == '\'')  /* 2 successive quotes? */ 
                {
                   value[jj] = card[ii];
                   ii++;  
                   jj++;
                }
                else
                {
                    value[jj] = card[ii];
                    break;   /* found the closing quote, so exit this loop  */
                }
            }
            if (jj < FLEN_VALUE-1)
               value[jj] = card[ii];  /* copy the next character to the output */
        }

        if (ii == cardlen || jj >= FLEN_VALUE-1)
        {
            jj = minvalue(jj, FLEN_VALUE-2);  /* don't exceed 70 char string length */
            value[jj] = '\'';  /*  close the bad value string  */
            value[jj+1] = '\0';  /*  terminate the bad value string  */
            ffpmsg("This keyword string value has no closing quote:");
            ffpmsg(card);
	    /*  May 2008 - modified to not fail on this minor error  */
/*            return(*status = NO_QUOTE);  */
        }
        else
        {
            value[jj+1] = '\0';  /*  terminate the good value string  */
            ii++;   /*  point to the character following the value  */
        }
    }
    else if (card[ii] == '(' )  /* is this a complex value? */
    {
        nblank = strcspn(&card[ii], ")" ); /* find closing ) */
        if (nblank == strlen( &card[ii] ) || nblank >= FLEN_VALUE-1 )
        {
            ffpmsg("This complex keyword value has no closing ')' within range:");
            ffpmsg(card);
            return(*status = NO_QUOTE);
        }

        nblank++;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;        
    }
    else   /*  an integer, floating point, or logical FITS value string  */
    {
        nblank = strcspn(&card[ii], " /");  /* find the end of the token */
        if (nblank >= FLEN_VALUE) /* This should not happen for correct input */
           nblank = FLEN_VALUE-1;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;
    }

    /*  now find the comment string, if any  */
    if (comm)
    {
      nblank = strspn(&card[ii], " ");  /*  find next non-space character  */
      ii = ii + nblank;

      if (ii < 80)
      {
        if (card[ii] == '/')   /*  ignore the slash separator  */
        {
            ii++;
            if (card[ii] == ' ')  /*  also ignore the following space  */
                ii++;
        }
        strncpy(comm, &card[ii],FLEN_COMMENT-1);  /*  copy the remaining characters  */
        comm[FLEN_COMMENT-1] = '\0';

        jj=strlen(comm);
        for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
        {
            if (comm[jj] == ' ')
                comm[jj] = '\0';
            else
                break;
        }
      }
    }
    return(*status);
}